

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

string * __thiscall
cmMakefile::GetModulesFile
          (string *__return_storage_ptr__,cmMakefile *this,string *filename,bool *system)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  cmMakefile *this_00;
  bool bVar4;
  PolicyStatus PVar5;
  string *psVar6;
  size_t sVar7;
  ostream *poVar8;
  PolicyID id;
  pointer pcVar9;
  pointer pbVar10;
  bool *pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  string moduleInCMakeRoot;
  string moduleInCMakeModulePath;
  string itempl;
  undefined1 local_248 [40];
  bool *local_220;
  string local_218;
  cmMakefile *local_1f8;
  string local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = '\0';
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MODULE_PATH","");
  psVar6 = GetDef(this,(string *)local_1a8);
  if (psVar6 == (string *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = (psVar6->_M_dataplus)._M_p;
  }
  local_1f8 = this;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_220 = system;
  if (pcVar9 != (char *)0x0) {
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_248._16_8_ = (pointer)0x0;
    local_1a8._0_8_ = pcVar1;
    sVar7 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar9,pcVar9 + sVar7);
    cmSystemTools::ExpandListArgument
              ((string *)local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248,false);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    uVar3 = local_248._8_8_;
    if (local_248._0_8_ != local_248._8_8_) {
      pbVar10 = (pointer)local_248._0_8_;
      do {
        pcVar9 = (pbVar10->_M_dataplus)._M_p;
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar9,pcVar9 + pbVar10->_M_string_length);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1a8);
        std::__cxx11::string::append((char *)local_1a8);
        std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(filename->_M_dataplus)._M_p);
        bVar4 = cmsys::SystemTools::FileExists((string *)local_1a8);
        if (bVar4) {
          std::__cxx11::string::_M_assign((string *)&local_1c8);
          if ((pointer)local_1a8._0_8_ != pcVar1) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          break;
        }
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != (pointer)uVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248);
  }
  pbVar11 = local_220;
  cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&local_218);
  std::__cxx11::string::append((char *)&local_218);
  std::__cxx11::string::_M_append((char *)&local_218,(ulong)(filename->_M_dataplus)._M_p);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_218);
  bVar4 = cmsys::SystemTools::FileExists(&local_218);
  if (!bVar4) {
    local_218._M_string_length = 0;
    *local_218._M_dataplus._M_p = '\0';
  }
  *pbVar11 = false;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (__return_storage_ptr__->_M_string_length == 0) {
    *pbVar11 = true;
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((local_1c0 == 0) || (local_218._M_string_length == 0)) goto LAB_00186f87;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_CURRENT_LIST_FILE","");
  psVar6 = GetDef(local_1f8,(string *)local_1a8);
  if (psVar6 == (string *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = (psVar6->_M_dataplus)._M_p;
  }
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_248._0_8_ = local_248 + 0x10;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar2,pcVar2 + psVar6->_M_string_length);
  std::__cxx11::string::append(local_248);
  if (pcVar9 != (char *)0x0) {
    local_1a8._0_8_ = pcVar1;
    sVar7 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar9,pcVar9 + sVar7);
    bVar4 = cmsys::SystemTools::IsSubDirectory((string *)local_1a8,(string *)local_248);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar4) {
      PVar5 = cmStateSnapshot::GetPolicy(&local_1f8->StateSnapshot,CMP0017,false);
      pbVar11 = local_220;
      if (PVar5 - NEW < 3) {
        bVar4 = true;
      }
      else if (PVar5 == OLD) {
        bVar4 = false;
      }
      else {
        if (PVar5 != WARN) goto LAB_00186f6b;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"File ",5);
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," includes ",10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1c8,local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," (found via CMAKE_MODULE_PATH) which shadows ",0x2d);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_218._M_dataplus._M_p,local_218._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,". This may cause errors later on .\n",0x23);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x11,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        this_00 = local_1f8;
        pbVar11 = local_220;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        IssueMessage(this_00,AUTHOR_WARNING,&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar4 = false;
      }
      *pbVar11 = bVar4;
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
LAB_00186f6b:
  if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
LAB_00186f87:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetModulesFile(const std::string& filename,
                                       bool& system) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  const char* cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath;
    cmSystemTools::ExpandListArgument(cmakeModulePath, modulePath);

    // Look through the possible module directories.
    for (std::string itempl : modulePath) {
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl)) {
        moduleInCMakeModulePath = itempl;
        break;
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot = cmSystemTools::GetCMakeRoot();
  moduleInCMakeRoot += "/Modules/";
  moduleInCMakeRoot += filename;
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot)) {
    moduleInCMakeRoot.clear();
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  system = false;
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    system = true;
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    const char* currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          system = false;
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          system = true;
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}